

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureFormatTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::TextureCubeArrayFormatCase::iterate(TextureCubeArrayFormatCase *this)

{
  int iVar1;
  bool bVar2;
  qpTestResult qVar3;
  int iVar4;
  TextureCubeArray *this_00;
  bool isOk;
  TextureCubeArrayFormatCase *this_local;
  
  qVar3 = tcu::TestContext::getTestResult((this->super_TestCase).super_TestNode.m_testCtx);
  if (qVar3 == QP_TEST_RESULT_NOT_SUPPORTED) {
    this_local._4_4_ = STOP;
  }
  else {
    bVar2 = testLayerFace(this,this->m_curLayerFace);
    if ((!bVar2) &&
       (qVar3 = tcu::TestContext::getTestResult((this->super_TestCase).super_TestNode.m_testCtx),
       qVar3 == QP_TEST_RESULT_PASS)) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Image comparison failed");
    }
    this->m_curLayerFace = this->m_curLayerFace + 1;
    iVar1 = this->m_curLayerFace;
    this_00 = glu::TextureCubeArray::getRefTexture(this->m_texture);
    iVar4 = tcu::TextureCubeArray::getDepth(this_00);
    this_local._4_4_ = (IterateResult)(iVar1 < iVar4);
  }
  return this_local._4_4_;
}

Assistant:

TextureCubeArrayFormatCase::IterateResult TextureCubeArrayFormatCase::iterate (void)
{
	if (m_testCtx.getTestResult() == QP_TEST_RESULT_NOT_SUPPORTED)
		return STOP;

	// Execute test for all layers.
	bool isOk = testLayerFace(m_curLayerFace);

	if (!isOk && m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image comparison failed");

	m_curLayerFace += 1;

	return m_curLayerFace < m_texture->getRefTexture().getDepth() ? CONTINUE : STOP;
}